

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# music_midi_base.cpp
# Opt level: O0

void Cmd_snd_listmididevices(FCommandLine *argv,APlayerPawn *who,int key)

{
  int iVar1;
  char *pcVar2;
  int key_local;
  APlayerPawn *who_local;
  FCommandLine *argv_local;
  
  iVar1 = FIntCVar::operator_cast_to_int(&snd_mididevice);
  pcVar2 = "";
  if (iVar1 == -6) {
    pcVar2 = "\x1c+";
  }
  Printf("%s-6. WildMidi\n",pcVar2);
  iVar1 = FIntCVar::operator_cast_to_int(&snd_mididevice);
  pcVar2 = "";
  if (iVar1 == -5) {
    pcVar2 = "\x1c+";
  }
  Printf("%s-5. FluidSynth\n",pcVar2);
  iVar1 = FIntCVar::operator_cast_to_int(&snd_mididevice);
  pcVar2 = "";
  if (iVar1 == -4) {
    pcVar2 = "\x1c+";
  }
  Printf("%s-4. Gravis Ultrasound Emulation\n",pcVar2);
  iVar1 = FIntCVar::operator_cast_to_int(&snd_mididevice);
  pcVar2 = "";
  if (iVar1 == -3) {
    pcVar2 = "\x1c+";
  }
  Printf("%s-3. Emulated OPL FM Synth\n",pcVar2);
  iVar1 = FIntCVar::operator_cast_to_int(&snd_mididevice);
  pcVar2 = "";
  if (iVar1 == -2) {
    pcVar2 = "\x1c+";
  }
  Printf("%s-2. TiMidity++\n",pcVar2);
  iVar1 = FIntCVar::operator_cast_to_int(&snd_mididevice);
  pcVar2 = "";
  if (iVar1 == -1) {
    pcVar2 = "\x1c+";
  }
  Printf("%s-1. Sound System\n",pcVar2);
  return;
}

Assistant:

CCMD (snd_listmididevices)
{
	Printf("%s-6. WildMidi\n", -6 == snd_mididevice ? TEXTCOLOR_BOLD : "");
#ifdef HAVE_FLUIDSYNTH
	Printf("%s-5. FluidSynth\n", -5 == snd_mididevice ? TEXTCOLOR_BOLD : "");
#endif
	Printf("%s-4. Gravis Ultrasound Emulation\n", -4 == snd_mididevice ? TEXTCOLOR_BOLD : "");
	Printf("%s-3. Emulated OPL FM Synth\n", -3 == snd_mididevice ? TEXTCOLOR_BOLD : "");
	Printf("%s-2. TiMidity++\n", -2 == snd_mididevice ? TEXTCOLOR_BOLD : "");
	Printf("%s-1. Sound System\n", -1 == snd_mididevice ? TEXTCOLOR_BOLD : "");
}